

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

string * removeSuffix(string *str)

{
  long lVar1;
  string *in_RSI;
  string *in_RDI;
  size_type pos;
  
  lVar1 = std::__cxx11::string::rfind((char)in_RSI,0x2e);
  if (lVar1 == -1) {
    std::__cxx11::string::string((string *)in_RDI,in_RSI);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)in_RSI);
  }
  return in_RDI;
}

Assistant:

std::string removeSuffix(const std::string& str) {
  auto pos = str.rfind('.');
  if (pos != std::string::npos) {
    return str.substr(0, pos);
  }
  return str;
}